

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O3

void pnga_access_ghost_element_ptr(Integer g_a,void *ptr,Integer *subscript,Integer *ld)

{
  long lVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  global_array_t *pgVar5;
  Integer IVar6;
  ulong uVar7;
  Integer IVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  C_Integer CVar12;
  size_t __n;
  int _ndim;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int _index [7];
  Integer _hi [7];
  Integer _lo [7];
  Integer tmp_sub [7];
  int local_108 [8];
  long local_e8 [8];
  long local_a8 [7];
  long alStack_70 [8];
  
  lVar1 = g_a + 1000;
  IVar6 = pnga_nodeid();
  pgVar5 = GA;
  uVar2 = GA[lVar1].ndim;
  uVar13 = (ulong)(short)uVar2;
  if (0 < (long)uVar13) {
    uVar7 = 0;
    do {
      alStack_70[uVar7 + 1] = subscript[uVar7] + -1;
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
  }
  iVar10 = GA[lVar1].distr_type;
  if (iVar10 - 1U < 3) {
    lVar9 = GA[lVar1].num_blocks[0];
    lVar11 = (long)(int)IVar6 % lVar9;
    local_108[0] = (int)lVar11;
    if (1 < (short)uVar2) {
      lVar15 = 0;
      IVar8 = IVar6;
      do {
        IVar8 = (long)((int)IVar8 - (int)lVar11) / lVar9;
        lVar9 = GA[g_a + 1000].num_blocks[lVar15 + 1];
        lVar11 = (long)(int)IVar8 % lVar9;
        local_108[lVar15 + 1] = (int)lVar11;
        lVar15 = lVar15 + 1;
      } while ((uVar13 & 0xffffffff) - 1 != lVar15);
    }
    if (0 < (short)uVar2) {
      lVar9 = 0;
      do {
        iVar10 = *(int *)((long)local_108 + lVar9);
        lVar11 = *(long *)((long)GA[g_a + 1000].block_dims + lVar9 * 2);
        *(long *)((long)local_a8 + lVar9 * 2) = lVar11 * iVar10 + 1;
        lVar11 = ((long)iVar10 + 1) * lVar11;
        lVar15 = *(long *)((long)GA[g_a + 1000].dims + lVar9 * 2);
        if (lVar15 <= lVar11) {
          lVar11 = lVar15;
        }
        *(long *)((long)local_e8 + lVar9 * 2) = lVar11;
        lVar9 = lVar9 + 4;
      } while ((uVar13 & 0xffffffff) << 2 != lVar9);
    }
    goto LAB_00185b0e;
  }
  if (iVar10 == 4) {
    lVar9 = GA[lVar1].num_blocks[0];
    lVar11 = (long)(int)IVar6 % lVar9;
    local_108[0] = (int)lVar11;
    if (1 < (short)uVar2) {
      lVar15 = 0;
      IVar8 = IVar6;
      do {
        IVar8 = (long)((int)IVar8 - (int)lVar11) / lVar9;
        lVar9 = GA[g_a + 1000].num_blocks[lVar15 + 1];
        lVar11 = (long)(int)IVar8 % lVar9;
        local_108[lVar15 + 1] = (int)lVar11;
        lVar15 = lVar15 + 1;
      } while ((uVar13 & 0xffffffff) - 1 != lVar15);
    }
    if (0 < (short)uVar2) {
      pCVar4 = GA[lVar1].mapc;
      lVar9 = 0;
      iVar10 = 0;
      do {
        iVar3 = *(int *)((long)local_108 + lVar9);
        lVar15 = (long)iVar10 + (long)iVar3;
        *(C_Integer *)((long)local_a8 + lVar9 * 2) = pCVar4[lVar15];
        lVar11 = *(long *)((long)GA[lVar1].num_blocks + lVar9 * 2);
        if ((long)iVar3 < lVar11 + -1) {
          lVar15 = pCVar4[lVar15 + 1] + -1;
        }
        else {
          lVar15 = *(long *)((long)GA[lVar1].dims + lVar9 * 2);
        }
        *(long *)((long)local_e8 + lVar9 * 2) = lVar15;
        iVar10 = iVar10 + (int)lVar11;
        lVar9 = lVar9 + 4;
      } while ((uVar13 & 0xffffffff) << 2 != lVar9);
    }
    goto LAB_00185b0e;
  }
  if (iVar10 != 0) goto LAB_00185b0e;
  if (GA[lVar1].num_rstrctd == 0) {
    if ((short)uVar2 < 1) goto LAB_00185b0e;
    lVar9 = 1;
    uVar7 = 0;
    do {
      lVar9 = lVar9 * GA[g_a + 1000].nblock[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar13 != uVar7);
    if ((-1 < IVar6) && (IVar6 < lVar9)) {
      if (0 < (short)uVar2) {
        pCVar4 = GA[lVar1].mapc;
        uVar7 = 0;
        lVar9 = 0;
        IVar8 = IVar6;
        do {
          lVar15 = (long)GA[g_a + 1000].nblock[uVar7];
          lVar11 = IVar8 % lVar15;
          local_a8[uVar7] = pCVar4[lVar11 + lVar9];
          if (lVar11 == lVar15 + -1) {
            CVar12 = GA[g_a + 1000].dims[uVar7];
          }
          else {
            CVar12 = pCVar4[lVar11 + lVar9 + 1] + -1;
          }
          lVar9 = lVar9 + lVar15;
          local_e8[uVar7] = CVar12;
          uVar7 = uVar7 + 1;
          IVar8 = IVar8 / lVar15;
        } while (uVar13 != uVar7);
      }
      goto LAB_00185b0e;
    }
LAB_00185ad4:
    if ((short)uVar2 < 1) goto LAB_00185b0e;
    __n = uVar13 * 8;
  }
  else {
    if (IVar6 < GA[lVar1].num_rstrctd) {
      if ((short)uVar2 < 1) goto LAB_00185b0e;
      lVar9 = 1;
      uVar7 = 0;
      do {
        lVar9 = lVar9 * GA[g_a + 1000].nblock[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
      if ((-1 < IVar6) && (IVar6 < lVar9)) {
        if (0 < (short)uVar2) {
          pCVar4 = GA[lVar1].mapc;
          lVar9 = 0;
          uVar7 = 0;
          IVar8 = IVar6;
          do {
            lVar15 = (long)GA[g_a + 1000].nblock[uVar7];
            lVar11 = IVar8 % lVar15;
            local_a8[uVar7] = pCVar4[lVar11 + lVar9];
            if (lVar11 == lVar15 + -1) {
              CVar12 = GA[g_a + 1000].dims[uVar7];
            }
            else {
              CVar12 = pCVar4[lVar11 + lVar9 + 1] + -1;
            }
            lVar9 = lVar9 + lVar15;
            local_e8[uVar7] = CVar12;
            uVar7 = uVar7 + 1;
            IVar8 = IVar8 / lVar15;
          } while (uVar13 != uVar7);
        }
        goto LAB_00185b0e;
      }
      goto LAB_00185ad4;
    }
    if ((short)uVar2 < 1) goto LAB_00185b0e;
    __n = (ulong)uVar2 << 3;
  }
  memset(local_a8,0,__n);
  memset(local_e8,0xff,__n);
LAB_00185b0e:
  if (uVar13 == 1) {
    *ld = (local_e8[0] - local_a8[0]) + pgVar5[lVar1].width[0] * 2 + 1;
  }
  if ((short)uVar2 < 2) {
    lVar9 = 1;
    lVar11 = 0;
  }
  else {
    lVar9 = 1;
    lVar15 = 0;
    lVar11 = 0;
    do {
      lVar11 = lVar11 + alStack_70[lVar15 + 1] * lVar9;
      lVar14 = (local_e8[lVar15] - local_a8[lVar15]) + pgVar5[g_a + 1000].width[lVar15] * 2 + 1;
      ld[lVar15] = lVar14;
      lVar9 = lVar9 * lVar14;
      lVar15 = lVar15 + 1;
    } while (uVar13 - 1 != lVar15);
  }
  *(char **)ptr =
       pgVar5[lVar1].ptr[IVar6] +
       (long)pgVar5[lVar1].elemsize * (lVar9 * alStack_70[uVar13] + lVar11);
  return;
}

Assistant:

void pnga_access_ghost_element_ptr(Integer g_a, void *ptr, 
                        Integer subscript[], Integer ld[]) 
{ 
  char *lptr; 
  Integer  handle = GA_OFFSET + g_a; 
  Integer i; 
  Integer tmp_sub[MAXDIM]; 
  Integer me = pnga_nodeid(); 
  /* Indices conform to Fortran convention. Shift them down 1 so that 
     gam_LocationWithGhosts works. */ 
  for (i=0; i<GA[handle].ndim; i++) tmp_sub[i] = subscript[i] - 1; 
  gam_LocationWithGhosts(me, handle, tmp_sub, &lptr, ld); 
 
  *(char**)ptr = lptr; 
}